

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O2

void __thiscall
RootIndexProxyModelPrivate::onColumnsMoved
          (RootIndexProxyModelPrivate *this,QModelIndex *sourceParent,int sourceStart,int sourceEnd,
          QModelIndex *destParent,int dest)

{
  QModelIndex QVar1;
  QModelIndex childIdx;
  bool bVar2;
  bool bVar3;
  RootIndexProxyModelPrivate *pRVar4;
  QPersistentModelIndex *this_00;
  undefined1 local_90 [48];
  Data *local_60;
  QPersistentModelIndex *pQStack_58;
  QAbstractItemModel *local_50;
  QPersistentModelIndex local_48;
  QModelIndex *pQStack_40;
  QAbstractItemModel *local_38;
  
  bVar2 = ignoreMove(this,sourceParent,destParent);
  if (!bVar2) {
    this_00 = &this->m_rootIndex;
    pRVar4 = (RootIndexProxyModelPrivate *)&stack0xffffffffffffffb8;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar4,this_00);
    QVar1.i = (quintptr)pQStack_40;
    QVar1._0_8_ = local_48.d;
    QVar1.m = local_38;
    bVar2 = isDescendant(pRVar4,QVar1,destParent);
    pRVar4 = (RootIndexProxyModelPrivate *)&local_60;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar4,this_00);
    childIdx.i = (quintptr)pQStack_58;
    childIdx._0_8_ = local_60;
    childIdx.m = local_50;
    bVar3 = isDescendant(pRVar4,childIdx,sourceParent);
    if (bVar2 == bVar3) {
      if (!bVar2) {
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)(local_90 + 0x18),this_00);
        bVar2 = QModelIndex::operator!=(destParent,(QModelIndex *)(local_90 + 0x18));
        if (bVar2) {
          QVar1 = *destParent;
          pRVar4 = (RootIndexProxyModelPrivate *)local_90;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_90,this_00);
          bVar2 = isDescendant(pRVar4,QVar1,(QModelIndex *)local_90);
          if (!bVar2) {
            return;
          }
        }
        QAbstractItemModel::endMoveColumns();
      }
    }
    else if (bVar2) {
      QAbstractItemModel::endRemoveColumns();
    }
    else {
      QAbstractItemModel::endInsertColumns();
    }
  }
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onColumnsMoved(const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destParent,
                                                int dest)
{
    Q_UNUSED(sourceStart)
    Q_UNUSED(sourceEnd)
    Q_UNUSED(dest)
    Q_Q(RootIndexProxyModel);
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == q->sourceModel());
    Q_ASSERT(!destParent.isValid() || destParent.model() == q->sourceModel());
    if (ignoreMove(sourceParent, destParent))
        return;
    const bool isDescendantRootDestParent = isDescendant(m_rootIndex, destParent);
    if (isDescendantRootDestParent == isDescendant(m_rootIndex, sourceParent)) {
        if (isDescendantRootDestParent)
            return;
        if (destParent != m_rootIndex && !isDescendant(destParent, m_rootIndex))
            return;
        q->endMoveColumns();
    } else if (isDescendantRootDestParent)
        q->endRemoveColumns();
    else
        q->endInsertColumns();
}